

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O1

void __thiscall
Fl_PostScript_Graphics_Driver::draw_image
          (Fl_PostScript_Graphics_Driver *this,Fl_Draw_Image_Cb call,void *data,int ix,int iy,int iw
          ,int ih,int D)

{
  byte bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  uchar *puVar8;
  undefined8 *data_00;
  void *pvVar9;
  byte b;
  byte b_00;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  int iVar13;
  byte *pbVar14;
  uchar *puVar15;
  byte b_01;
  long lVar16;
  undefined4 uVar17;
  uchar *local_50;
  
  dVar3 = (double)iy;
  dVar4 = (double)iw;
  dVar5 = (double)ih;
  fwrite("save\n",5,1,(FILE *)this->output);
  iVar7 = this->lang_level_;
  uVar17 = SUB84((double)ix,0);
  if (iVar7 < 2) {
    fprintf((FILE *)this->output,"%g %g %g %g %i %i CI",uVar17,dVar3 + dVar5,dVar4,-dVar5,
            (ulong)(uint)iw,(ulong)(uint)ih);
  }
  else {
    pcVar12 = "true";
    if (this->interpolate_ == 0) {
      pcVar12 = "false";
    }
    if (iVar7 == 2 || this->mask == (uchar *)0x0) {
      if (iVar7 == 2 && this->mask != (uchar *)0x0) {
        fprintf((FILE *)this->output," %g %g %g %g %d %d pixmap_plot\n",uVar17,dVar3,dVar4,
                (ulong)(uint)iw,(ulong)(uint)ih);
        bVar2 = false;
        goto LAB_002090e6;
      }
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %s CII\n",uVar17,dVar3 + dVar5,dVar4,-dVar5,
              (ulong)(uint)iw,(ulong)(uint)ih);
    }
    else {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %i %i %s CIM\n",uVar17,dVar3 + dVar5,dVar4,
              -dVar5,(ulong)(uint)iw,(ulong)(uint)ih,(ulong)(uint)this->mx,(ulong)(uint)this->my,
              pcVar12);
    }
  }
  bVar2 = true;
LAB_002090e6:
  puVar8 = (uchar *)operator_new__((long)(D * iw));
  local_50 = this->mask;
  data_00 = (undefined8 *)operator_new(0x90);
  data_00[0x11] = 0;
  pvVar9 = operator_new(0x14);
  *(undefined8 *)((long)pvVar9 + 4) = 0;
  *data_00 = pvVar9;
  if (bVar2) {
    if (0 < ih) {
      iVar7 = 0;
      do {
        if (((this->mask != (uchar *)0x0) && (2 < this->lang_level_)) && (0 < this->my / ih)) {
          iVar13 = 0;
          do {
            if (0 < this->mx) {
              lVar16 = 0;
              do {
                write_rle85(this,""[local_50[lVar16] & 0xf] << 4 | ""[local_50[lVar16] >> 4],data_00
                           );
                iVar10 = this->mx + 7;
                iVar6 = this->mx + 0xe;
                if (-1 < iVar10) {
                  iVar6 = iVar10;
                }
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 < iVar6 >> 3);
              local_50 = local_50 + lVar16;
            }
            iVar13 = iVar13 + 1;
          } while (iVar13 < this->my / ih);
        }
        (*call)(data,0,iVar7,iw,puVar8);
        pbVar14 = puVar8 + 3;
        iVar13 = iw;
        if (0 < iw) {
          do {
            b = pbVar14[-3];
            b_00 = pbVar14[-2];
            b_01 = pbVar14[-1];
            if ((3 < D) && (this->lang_level_ < 3)) {
              bVar1 = *pbVar14;
              uVar11 = bVar1 ^ 0xff;
              b = (byte)((this->bg_r * uVar11 + (uint)b * (uint)bVar1) / 0xff);
              b_00 = (byte)((this->bg_g * uVar11 + (uint)b_00 * (uint)bVar1) / 0xff);
              b_01 = (byte)((ulong)(this->bg_b * uVar11 + (uint)b_01 * (uint)bVar1) / 0xff);
            }
            write_rle85(this,b,data_00);
            write_rle85(this,b_00,data_00);
            write_rle85(this,b_01,data_00);
            iVar13 = iVar13 + -1;
            pbVar14 = pbVar14 + D;
          } while (iVar13 != 0);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != ih);
    }
  }
  else {
    iVar7 = ih + -1;
    if (0 < ih) {
      iVar13 = iVar7;
      do {
        (*call)(data,0,iVar13,iw,puVar8);
        puVar15 = puVar8 + 2;
        iVar10 = iw;
        if (0 < iw) {
          do {
            write_rle85(this,puVar15[-2],data_00);
            write_rle85(this,puVar15[-1],data_00);
            write_rle85(this,*puVar15,data_00);
            iVar10 = iVar10 + -1;
            puVar15 = puVar15 + D;
          } while (iVar10 != 0);
        }
        bVar2 = 0 < iVar13;
        iVar13 = iVar13 + -1;
      } while (bVar2);
    }
    close_rle85(this,data_00);
    fputc(10,(FILE *)this->output);
    data_00 = (undefined8 *)operator_new(0x90);
    data_00[0x11] = 0;
    pvVar9 = operator_new(0x14);
    *(undefined8 *)((long)pvVar9 + 4) = 0;
    *data_00 = pvVar9;
    if (0 < ih) {
      do {
        if (0 < this->my / ih) {
          iVar13 = this->mx + 7;
          iVar10 = this->mx + 0xe;
          if (-1 < iVar13) {
            iVar10 = iVar13;
          }
          puVar15 = this->mask + (iVar10 >> 3) * iVar7 * (this->my / ih);
          iVar13 = 0;
          do {
            if (0 < this->mx) {
              lVar16 = 0;
              do {
                write_rle85(this,""[puVar15[lVar16] & 0xf] << 4 | ""[puVar15[lVar16] >> 4],data_00);
                iVar10 = this->mx + 7;
                iVar6 = this->mx + 0xe;
                if (-1 < iVar10) {
                  iVar6 = iVar10;
                }
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 < iVar6 >> 3);
              puVar15 = puVar15 + lVar16;
            }
            iVar13 = iVar13 + 1;
          } while (iVar13 < this->my / ih);
        }
        bVar2 = 0 < iVar7;
        iVar7 = iVar7 + -1;
      } while (bVar2);
    }
  }
  close_rle85(this,data_00);
  fwrite("\nrestore\n",9,1,(FILE *)this->output);
  operator_delete__(puVar8);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw_image(Fl_Draw_Image_Cb call, void *data, int ix, int iy, int iw, int ih, int D) {
  double x = ix, y = iy, w = iw, h = ih;

  int level2_mask = 0;
  fprintf(output,"save\n");
  int i,j,k;
  const char * interpol;
  if (lang_level_ > 1) {
    if (interpolate_) interpol="true";
    else interpol="false";
    if (mask && lang_level_ > 2) {
      fprintf(output, "%g %g %g %g %i %i %i %i %s CIM\n", x , y+h , w , -h , iw , ih, mx, my, interpol);
    }
    else if (mask && lang_level_ == 2) {
      level2_mask = 1; // use method for drawing masked color image with PostScript level 2
      fprintf(output, " %g %g %g %g %d %d pixmap_plot\n", x, y, w, h, iw, ih);
    }
    else {
      fprintf(output, "%g %g %g %g %i %i %s CII\n", x , y+h , w , -h , iw , ih, interpol);
    }
  } else {
    fprintf(output , "%g %g %g %g %i %i CI", x , y+h , w , -h , iw , ih);
  }
  
  int LD=iw*D;
  uchar *rgbdata=new uchar[LD];
  uchar *curmask=mask;
  void *big = prepare_rle85();
  
  if (level2_mask) {
    for (j = ih - 1; j >= 0; j--) { // output full image data
      call(data, 0, j, iw, rgbdata);
      uchar *curdata = rgbdata;
      for (i=0 ; i<iw ; i++) {
        write_rle85(curdata[0], big); write_rle85(curdata[1], big); write_rle85(curdata[2], big);
        curdata += D;
      }
    }
    close_rle85(big); fputc('\n', output);
    big = prepare_rle85();
    for (j = ih - 1; j >= 0; j--) { // output mask data
      curmask = mask + j * (my/ih) * ((mx+7)/8);
      for (k=0; k < my/ih; k++) {
        for (i=0; i < ((mx+7)/8); i++) {
          write_rle85(swap_byte(*curmask), big);
          curmask++;
        }
      }
    }
  }
  else {
    for (j=0; j<ih;j++) {
      if (mask && lang_level_ > 2) {  // InterleaveType 2 mask data
        for (k=0; k<my/ih;k++) { //for alpha pseudo-masking
          for (i=0; i<((mx+7)/8);i++) {
            write_rle85(swap_byte(*curmask), big);
            curmask++;
          }
        }
      }
      call(data,0,j,iw,rgbdata);
      uchar *curdata=rgbdata;
      for (i=0 ; i<iw ; i++) {
        uchar r = curdata[0];
        uchar g =  curdata[1];
        uchar b =  curdata[2];
        
        if (lang_level_<3 && D>3) { //can do  mixing using bg_* colors)
          unsigned int a2 = curdata[3]; //must be int
          unsigned int a = 255-a2;
          r = (a2 * r + bg_r * a)/255;
          g = (a2 * g + bg_g * a)/255;
          b = (a2 * b + bg_b * a)/255;
        }
        
        write_rle85(r, big); write_rle85(g, big); write_rle85(b, big);
        curdata +=D;
      }
      
    }
  }
  close_rle85(big);
  fprintf(output,"\nrestore\n");
  delete[] rgbdata;
}